

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct16_low8_ssse3(__m128i *input,__m128i *output)

{
  __m128i __rounding_00;
  __m128i __rounding_01;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined8 uVar27;
  undefined8 uVar28;
  undefined2 uVar29;
  short sVar30;
  uint uVar31;
  int iVar32;
  int32_t *piVar33;
  undefined1 (*in_RDI) [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i _in1_5;
  __m128i _in0_5;
  __m128i _in1_4;
  __m128i _in0_4;
  __m128i _in_7;
  __m128i _w1_7;
  __m128i _w0_7;
  __m128i _in_6;
  __m128i _w1_6;
  __m128i _w0_6;
  __m128i _in1_3;
  __m128i _in0_3;
  __m128i _in1_2;
  __m128i _in0_2;
  __m128i _in1_1;
  __m128i _in0_1;
  __m128i _in1;
  __m128i _in0;
  __m128i _in_5;
  __m128i _w1_5;
  __m128i _w0_5;
  __m128i _in_4;
  __m128i _w1_4;
  __m128i _w0_4;
  __m128i _in_3;
  __m128i _w1_3;
  __m128i _w0_3;
  __m128i _in_2;
  __m128i _w1_2;
  __m128i _w0_2;
  __m128i _in_1;
  __m128i _w1_1;
  __m128i _w0_1;
  __m128i _in;
  __m128i _w1;
  __m128i _w0;
  __m128i x [16];
  __m128i cospi_m48_m16;
  __m128i cospi_p48_p16;
  __m128i cospi_m16_p48;
  __m128i __rounding;
  int32_t *cospi;
  int8_t cos_bit;
  int32_t *local_b48;
  __m128i *palStack_b40;
  int8_t iStack_b31;
  longlong lStack_b30;
  longlong local_b28;
  undefined2 local_808;
  undefined2 uStack_806;
  undefined2 uStack_804;
  undefined2 uStack_802;
  undefined2 local_7f8;
  undefined2 uStack_7f6;
  undefined2 uStack_7f4;
  undefined2 uStack_7f2;
  undefined2 local_7e8;
  undefined2 uStack_7e6;
  undefined2 uStack_7e4;
  undefined2 uStack_7e2;
  undefined2 local_7d8;
  undefined2 uStack_7d6;
  undefined2 uStack_7d4;
  undefined2 uStack_7d2;
  undefined2 uStack_7c0;
  undefined2 uStack_7be;
  undefined2 uStack_7bc;
  undefined2 uStack_7ba;
  undefined2 uStack_7b0;
  undefined2 uStack_7ae;
  undefined2 uStack_7ac;
  undefined2 uStack_7aa;
  undefined2 uStack_7a0;
  undefined2 uStack_79e;
  undefined2 uStack_79c;
  undefined2 uStack_79a;
  undefined2 uStack_790;
  undefined2 uStack_78e;
  undefined2 uStack_78c;
  undefined2 uStack_78a;
  int local_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_598;
  int iStack_594;
  int iStack_590;
  int iStack_58c;
  
  piVar33 = cospi_arr(0xc);
  uVar31 = -piVar33[0x10] & 0xffffU | piVar33[0x30] << 0x10;
  uVar27 = CONCAT44(uVar31,uVar31);
  uVar28 = CONCAT44(uVar31,uVar31);
  uVar31 = (uint)*(ushort *)(piVar33 + 0x30) | piVar33[0x10] << 0x10;
  iVar32 = (-piVar33[0x30] & 0xffffU) + piVar33[0x10] * -0x10000;
  uVar29 = (undefined2)(piVar33[0x3c] << 3);
  auVar2._2_2_ = uVar29;
  auVar2._0_2_ = uVar29;
  auVar2._4_2_ = uVar29;
  auVar2._6_2_ = uVar29;
  auVar2._10_2_ = uVar29;
  auVar2._8_2_ = uVar29;
  auVar2._12_2_ = uVar29;
  auVar2._14_2_ = uVar29;
  uVar29 = (undefined2)(piVar33[4] << 3);
  auVar1._2_2_ = uVar29;
  auVar1._0_2_ = uVar29;
  auVar1._4_2_ = uVar29;
  auVar1._6_2_ = uVar29;
  auVar1._10_2_ = uVar29;
  auVar1._8_2_ = uVar29;
  auVar1._12_2_ = uVar29;
  auVar1._14_2_ = uVar29;
  auVar34 = pmulhrsw(in_RDI[1],auVar2);
  auVar35 = pmulhrsw(in_RDI[1],auVar1);
  sVar30 = (short)piVar33[0x24] * -8;
  auVar47._2_2_ = sVar30;
  auVar47._0_2_ = sVar30;
  auVar47._4_2_ = sVar30;
  auVar47._6_2_ = sVar30;
  auVar47._10_2_ = sVar30;
  auVar47._8_2_ = sVar30;
  auVar47._12_2_ = sVar30;
  auVar47._14_2_ = sVar30;
  uVar29 = (undefined2)(piVar33[0x1c] << 3);
  auVar46._2_2_ = uVar29;
  auVar46._0_2_ = uVar29;
  auVar46._4_2_ = uVar29;
  auVar46._6_2_ = uVar29;
  auVar46._10_2_ = uVar29;
  auVar46._8_2_ = uVar29;
  auVar46._12_2_ = uVar29;
  auVar46._14_2_ = uVar29;
  auVar36 = pmulhrsw(in_RDI[7],auVar47);
  auVar37 = pmulhrsw(in_RDI[7],auVar46);
  uVar29 = (undefined2)(piVar33[0x2c] << 3);
  auVar38._2_2_ = uVar29;
  auVar38._0_2_ = uVar29;
  auVar38._4_2_ = uVar29;
  auVar38._6_2_ = uVar29;
  auVar38._10_2_ = uVar29;
  auVar38._8_2_ = uVar29;
  auVar38._12_2_ = uVar29;
  auVar38._14_2_ = uVar29;
  uVar29 = (undefined2)(piVar33[0x14] << 3);
  auVar39._2_2_ = uVar29;
  auVar39._0_2_ = uVar29;
  auVar39._4_2_ = uVar29;
  auVar39._6_2_ = uVar29;
  auVar39._10_2_ = uVar29;
  auVar39._8_2_ = uVar29;
  auVar39._12_2_ = uVar29;
  auVar39._14_2_ = uVar29;
  auVar38 = pmulhrsw(in_RDI[5],auVar38);
  auVar39 = pmulhrsw(in_RDI[5],auVar39);
  sVar30 = (short)piVar33[0x34] * -8;
  auVar40._2_2_ = sVar30;
  auVar40._0_2_ = sVar30;
  auVar40._4_2_ = sVar30;
  auVar40._6_2_ = sVar30;
  auVar40._10_2_ = sVar30;
  auVar40._8_2_ = sVar30;
  auVar40._12_2_ = sVar30;
  auVar40._14_2_ = sVar30;
  uVar29 = (undefined2)(piVar33[0xc] << 3);
  auVar41._2_2_ = uVar29;
  auVar41._0_2_ = uVar29;
  auVar41._4_2_ = uVar29;
  auVar41._6_2_ = uVar29;
  auVar41._10_2_ = uVar29;
  auVar41._8_2_ = uVar29;
  auVar41._12_2_ = uVar29;
  auVar41._14_2_ = uVar29;
  auVar40 = pmulhrsw(in_RDI[3],auVar40);
  auVar41 = pmulhrsw(in_RDI[3],auVar41);
  uVar29 = (undefined2)(piVar33[0x38] << 3);
  auVar42._2_2_ = uVar29;
  auVar42._0_2_ = uVar29;
  auVar42._4_2_ = uVar29;
  auVar42._6_2_ = uVar29;
  auVar42._10_2_ = uVar29;
  auVar42._8_2_ = uVar29;
  auVar42._12_2_ = uVar29;
  auVar42._14_2_ = uVar29;
  uVar29 = (undefined2)(piVar33[8] << 3);
  auVar43._2_2_ = uVar29;
  auVar43._0_2_ = uVar29;
  auVar43._4_2_ = uVar29;
  auVar43._6_2_ = uVar29;
  auVar43._10_2_ = uVar29;
  auVar43._8_2_ = uVar29;
  auVar43._12_2_ = uVar29;
  auVar43._14_2_ = uVar29;
  auVar42 = pmulhrsw(in_RDI[2],auVar42);
  auVar43 = pmulhrsw(in_RDI[2],auVar43);
  sVar30 = (short)piVar33[0x28] * -8;
  auVar44._2_2_ = sVar30;
  auVar44._0_2_ = sVar30;
  auVar44._4_2_ = sVar30;
  auVar44._6_2_ = sVar30;
  auVar44._10_2_ = sVar30;
  auVar44._8_2_ = sVar30;
  auVar44._12_2_ = sVar30;
  auVar44._14_2_ = sVar30;
  uVar29 = (undefined2)(piVar33[0x18] << 3);
  auVar45._2_2_ = uVar29;
  auVar45._0_2_ = uVar29;
  auVar45._4_2_ = uVar29;
  auVar45._6_2_ = uVar29;
  auVar45._10_2_ = uVar29;
  auVar45._8_2_ = uVar29;
  auVar45._12_2_ = uVar29;
  auVar45._14_2_ = uVar29;
  auVar44 = pmulhrsw(in_RDI[6],auVar44);
  auVar45 = pmulhrsw(in_RDI[6],auVar45);
  paddsw(auVar34,auVar36);
  auVar46 = psubsw(auVar34,auVar36);
  auVar47 = psubsw(auVar40,auVar38);
  paddsw(auVar40,auVar38);
  paddsw(auVar41,auVar39);
  auVar41 = psubsw(auVar41,auVar39);
  auVar40 = psubsw(auVar35,auVar37);
  paddsw(auVar35,auVar37);
  uVar29 = (undefined2)(piVar33[0x20] << 3);
  auVar37._2_2_ = uVar29;
  auVar37._0_2_ = uVar29;
  auVar37._4_2_ = uVar29;
  auVar37._6_2_ = uVar29;
  auVar37._10_2_ = uVar29;
  auVar37._8_2_ = uVar29;
  auVar37._12_2_ = uVar29;
  auVar37._14_2_ = uVar29;
  uVar29 = (undefined2)(piVar33[0x20] << 3);
  auVar36._2_2_ = uVar29;
  auVar36._0_2_ = uVar29;
  auVar36._4_2_ = uVar29;
  auVar36._6_2_ = uVar29;
  auVar36._10_2_ = uVar29;
  auVar36._8_2_ = uVar29;
  auVar36._12_2_ = uVar29;
  auVar36._14_2_ = uVar29;
  pmulhrsw(*in_RDI,auVar37);
  pmulhrsw(*in_RDI,auVar36);
  uVar29 = (undefined2)(piVar33[0x30] << 3);
  auVar35._2_2_ = uVar29;
  auVar35._0_2_ = uVar29;
  auVar35._4_2_ = uVar29;
  auVar35._6_2_ = uVar29;
  auVar35._10_2_ = uVar29;
  auVar35._8_2_ = uVar29;
  auVar35._12_2_ = uVar29;
  auVar35._14_2_ = uVar29;
  uVar29 = (undefined2)(piVar33[0x10] << 3);
  auVar34._2_2_ = uVar29;
  auVar34._0_2_ = uVar29;
  auVar34._4_2_ = uVar29;
  auVar34._6_2_ = uVar29;
  auVar34._10_2_ = uVar29;
  auVar34._8_2_ = uVar29;
  auVar34._12_2_ = uVar29;
  auVar34._14_2_ = uVar29;
  pmulhrsw(in_RDI[4],auVar35);
  pmulhrsw(in_RDI[4],auVar34);
  local_b48 = auVar44._0_8_;
  palStack_b40 = auVar44._8_8_;
  paddsw(auVar42,auVar44);
  psubsw(auVar42,auVar44);
  local_b28 = auVar43._0_8_;
  iStack_b31 = auVar45[7];
  lStack_b30 = auVar45._8_8_;
  psubsw(auVar43,auVar45);
  paddsw(auVar43,auVar45);
  local_7d8 = auVar46._0_2_;
  uStack_7d6 = auVar46._2_2_;
  uStack_7d4 = auVar46._4_2_;
  uStack_7d2 = auVar46._6_2_;
  local_7e8 = auVar40._0_2_;
  uStack_7e6 = auVar40._2_2_;
  uStack_7e4 = auVar40._4_2_;
  uStack_7e2 = auVar40._6_2_;
  uStack_790 = auVar46._8_2_;
  uStack_78e = auVar46._10_2_;
  uStack_78c = auVar46._12_2_;
  uStack_78a = auVar46._14_2_;
  uStack_7a0 = auVar40._8_2_;
  uStack_79e = auVar40._10_2_;
  uStack_79c = auVar40._12_2_;
  uStack_79a = auVar40._14_2_;
  auVar18._2_2_ = local_7e8;
  auVar18._0_2_ = local_7d8;
  auVar18._4_2_ = uStack_7d6;
  auVar18._6_2_ = uStack_7e6;
  auVar18._10_2_ = uStack_7e4;
  auVar18._8_2_ = uStack_7d4;
  auVar18._12_2_ = uStack_7d2;
  auVar18._14_2_ = uStack_7e2;
  auVar17._8_8_ = uVar28;
  auVar17._0_8_ = uVar27;
  auVar34 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = uStack_7a0;
  auVar16._0_2_ = uStack_790;
  auVar16._4_2_ = uStack_78e;
  auVar16._6_2_ = uStack_79e;
  auVar16._10_2_ = uStack_79c;
  auVar16._8_2_ = uStack_78c;
  auVar16._12_2_ = uStack_78a;
  auVar16._14_2_ = uStack_79a;
  auVar15._8_8_ = uVar28;
  auVar15._0_8_ = uVar27;
  auVar35 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = local_7e8;
  auVar14._0_2_ = local_7d8;
  auVar14._4_2_ = uStack_7d6;
  auVar14._6_2_ = uStack_7e6;
  auVar14._10_2_ = uStack_7e4;
  auVar14._8_2_ = uStack_7d4;
  auVar14._12_2_ = uStack_7d2;
  auVar14._14_2_ = uStack_7e2;
  auVar13._8_8_ = CONCAT44(uVar31,uVar31);
  auVar13._0_8_ = CONCAT44(uVar31,uVar31);
  auVar36 = pmaddwd(auVar14,auVar13);
  auVar12._2_2_ = uStack_7a0;
  auVar12._0_2_ = uStack_790;
  auVar12._4_2_ = uStack_78e;
  auVar12._6_2_ = uStack_79e;
  auVar12._10_2_ = uStack_79c;
  auVar12._8_2_ = uStack_78c;
  auVar12._12_2_ = uStack_78a;
  auVar12._14_2_ = uStack_79a;
  auVar11._8_8_ = CONCAT44(uVar31,uVar31);
  auVar11._0_8_ = CONCAT44(uVar31,uVar31);
  auVar37 = pmaddwd(auVar12,auVar11);
  local_598 = auVar34._0_4_;
  iStack_594 = auVar34._4_4_;
  iStack_590 = auVar34._8_4_;
  iStack_58c = auVar34._12_4_;
  local_5b8 = auVar35._0_4_;
  iStack_5b4 = auVar35._4_4_;
  iStack_5b0 = auVar35._8_4_;
  iStack_5ac = auVar35._12_4_;
  local_5d8 = auVar36._0_4_;
  iStack_5d4 = auVar36._4_4_;
  iStack_5d0 = auVar36._8_4_;
  iStack_5cc = auVar36._12_4_;
  local_5f8 = auVar37._0_4_;
  iStack_5f4 = auVar37._4_4_;
  iStack_5f0 = auVar37._8_4_;
  iStack_5ec = auVar37._12_4_;
  auVar34 = ZEXT416(0xc);
  auVar35 = ZEXT416(0xc);
  auVar36 = ZEXT416(0xc);
  auVar37 = ZEXT416(0xc);
  auVar26._4_4_ = iStack_594 + 0x800 >> auVar34;
  auVar26._0_4_ = local_598 + 0x800 >> auVar34;
  auVar26._12_4_ = iStack_58c + 0x800 >> auVar34;
  auVar26._8_4_ = iStack_590 + 0x800 >> auVar34;
  auVar25._4_4_ = iStack_5b4 + 0x800 >> auVar35;
  auVar25._0_4_ = local_5b8 + 0x800 >> auVar35;
  auVar25._12_4_ = iStack_5ac + 0x800 >> auVar35;
  auVar25._8_4_ = iStack_5b0 + 0x800 >> auVar35;
  packssdw(auVar26,auVar25);
  auVar24._4_4_ = iStack_5d4 + 0x800 >> auVar36;
  auVar24._0_4_ = local_5d8 + 0x800 >> auVar36;
  auVar24._12_4_ = iStack_5cc + 0x800 >> auVar36;
  auVar24._8_4_ = iStack_5d0 + 0x800 >> auVar36;
  auVar23._4_4_ = iStack_5f4 + 0x800 >> auVar37;
  auVar23._0_4_ = local_5f8 + 0x800 >> auVar37;
  auVar23._12_4_ = iStack_5ec + 0x800 >> auVar37;
  auVar23._8_4_ = iStack_5f0 + 0x800 >> auVar37;
  packssdw(auVar24,auVar23);
  local_7f8 = auVar47._0_2_;
  uStack_7f6 = auVar47._2_2_;
  uStack_7f4 = auVar47._4_2_;
  uStack_7f2 = auVar47._6_2_;
  local_808 = auVar41._0_2_;
  uStack_806 = auVar41._2_2_;
  uStack_804 = auVar41._4_2_;
  uStack_802 = auVar41._6_2_;
  uStack_7b0 = auVar47._8_2_;
  uStack_7ae = auVar47._10_2_;
  uStack_7ac = auVar47._12_2_;
  uStack_7aa = auVar47._14_2_;
  uStack_7c0 = auVar41._8_2_;
  uStack_7be = auVar41._10_2_;
  uStack_7bc = auVar41._12_2_;
  uStack_7ba = auVar41._14_2_;
  auVar10._2_2_ = local_808;
  auVar10._0_2_ = local_7f8;
  auVar10._4_2_ = uStack_7f6;
  auVar10._6_2_ = uStack_806;
  auVar10._10_2_ = uStack_804;
  auVar10._8_2_ = uStack_7f4;
  auVar10._12_2_ = uStack_7f2;
  auVar10._14_2_ = uStack_802;
  auVar9._8_8_ = CONCAT44(iVar32,iVar32);
  auVar9._0_8_ = CONCAT44(iVar32,iVar32);
  auVar34 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = uStack_7c0;
  auVar8._0_2_ = uStack_7b0;
  auVar8._4_2_ = uStack_7ae;
  auVar8._6_2_ = uStack_7be;
  auVar8._10_2_ = uStack_7bc;
  auVar8._8_2_ = uStack_7ac;
  auVar8._12_2_ = uStack_7aa;
  auVar8._14_2_ = uStack_7ba;
  auVar7._8_8_ = CONCAT44(iVar32,iVar32);
  auVar7._0_8_ = CONCAT44(iVar32,iVar32);
  auVar35 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = local_808;
  auVar6._0_2_ = local_7f8;
  auVar6._4_2_ = uStack_7f6;
  auVar6._6_2_ = uStack_806;
  auVar6._10_2_ = uStack_804;
  auVar6._8_2_ = uStack_7f4;
  auVar6._12_2_ = uStack_7f2;
  auVar6._14_2_ = uStack_802;
  auVar5._8_8_ = uVar28;
  auVar5._0_8_ = uVar27;
  auVar36 = pmaddwd(auVar6,auVar5);
  auVar4._2_2_ = uStack_7c0;
  auVar4._0_2_ = uStack_7b0;
  auVar4._4_2_ = uStack_7ae;
  auVar4._6_2_ = uStack_7be;
  auVar4._10_2_ = uStack_7bc;
  auVar4._8_2_ = uStack_7ac;
  auVar4._12_2_ = uStack_7aa;
  auVar4._14_2_ = uStack_7ba;
  auVar3._8_8_ = uVar28;
  auVar3._0_8_ = uVar27;
  auVar37 = pmaddwd(auVar4,auVar3);
  local_618 = auVar34._0_4_;
  iStack_614 = auVar34._4_4_;
  iStack_610 = auVar34._8_4_;
  iStack_60c = auVar34._12_4_;
  local_638 = auVar35._0_4_;
  iStack_634 = auVar35._4_4_;
  iStack_630 = auVar35._8_4_;
  iStack_62c = auVar35._12_4_;
  local_638 = local_638 + 0x800;
  iStack_634 = iStack_634 + 0x800;
  local_658 = auVar36._0_4_;
  iStack_654 = auVar36._4_4_;
  iStack_650 = auVar36._8_4_;
  iStack_64c = auVar36._12_4_;
  iStack_650 = iStack_650 + 0x800;
  iStack_64c = iStack_64c + 0x800;
  local_678 = auVar37._0_4_;
  iStack_674 = auVar37._4_4_;
  iStack_670 = auVar37._8_4_;
  iStack_66c = auVar37._12_4_;
  auVar34 = ZEXT416(0xc);
  auVar35 = ZEXT416(0xc);
  auVar36 = ZEXT416(0xc);
  auVar37 = ZEXT416(0xc);
  auVar22._4_4_ = iStack_614 + 0x800 >> auVar34;
  auVar22._0_4_ = local_618 + 0x800 >> auVar34;
  auVar22._12_4_ = iStack_60c + 0x800 >> auVar34;
  auVar22._8_4_ = iStack_610 + 0x800 >> auVar34;
  auVar21._4_4_ = iStack_634 >> auVar35;
  auVar21._0_4_ = local_638 >> auVar35;
  auVar21._12_4_ = iStack_62c + 0x800 >> auVar35;
  auVar21._8_4_ = iStack_630 + 0x800 >> auVar35;
  packssdw(auVar22,auVar21);
  auVar20._4_4_ = iStack_654 + 0x800 >> auVar36;
  auVar20._0_4_ = local_658 + 0x800 >> auVar36;
  auVar20._12_4_ = iStack_64c >> auVar36;
  auVar20._8_4_ = iStack_650 >> auVar36;
  auVar19._4_4_ = iStack_674 + 0x800 >> auVar37;
  auVar19._0_4_ = local_678 + 0x800 >> auVar37;
  auVar19._12_4_ = iStack_66c + 0x800 >> auVar37;
  auVar19._8_4_ = iStack_670 + 0x800 >> auVar37;
  packssdw(auVar20,auVar19);
  __rounding_00[0]._4_4_ = iStack_5ec + 0x800;
  __rounding_00[0]._0_4_ = iStack_5f0 + 0x800;
  __rounding_00[1]._0_4_ = local_5d8 + 0x800;
  __rounding_00[1]._4_4_ = iStack_5d4 + 0x800;
  idct16_stage5_sse2((__m128i *)CONCAT44(iStack_5ac + 0x800,iStack_5b0 + 0x800),
                     (int32_t *)CONCAT44(iStack_5b4 + 0x800,local_5b8 + 0x800),__rounding_00,
                     (int8_t)((uint)(iStack_5f4 + 0x800) >> 0x18));
  __rounding_01[1] = local_b28;
  __rounding_01[0] = lStack_b30;
  idct16_stage6_sse2(palStack_b40,local_b48,__rounding_01,iStack_b31);
  idct16_stage7_sse2((__m128i *)CONCAT44(iStack_634,local_638),
                     (__m128i *)CONCAT44(iStack_64c,iStack_650));
  return;
}

Assistant:

static void idct16_low8_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);

  // stage 1
  __m128i x[16];
  x[0] = input[0];
  x[2] = input[4];
  x[4] = input[2];
  x[6] = input[6];
  x[8] = input[1];
  x[10] = input[5];
  x[12] = input[3];
  x[14] = input[7];

  // stage 2
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[36], cospi[28], x[14], x[9], x[14]);
  btf_16_ssse3(cospi[44], cospi[20], x[10], x[10], x[13]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);

  // stage 3
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  btf_16_ssse3(-cospi[40], cospi[24], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[9]);
  btf_16_subs_adds_sse2(x[11], x[10]);
  btf_16_adds_subs_sse2(x[12], x[13]);
  btf_16_subs_adds_sse2(x[15], x[14]);

  // stage 4
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  btf_16_ssse3(cospi[48], cospi[16], x[2], x[2], x[3]);
  btf_16_adds_subs_sse2(x[4], x[5]);
  btf_16_subs_adds_sse2(x[7], x[6]);
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);

  idct16_stage5_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage6_sse2(x, cospi, __rounding, cos_bit);
  idct16_stage7_sse2(output, x);
}